

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::BuildEnumValue
          (DescriptorBuilder *this,EnumValueDescriptorProto *proto,EnumDescriptor *parent,
          EnumValueDescriptor *result)

{
  Symbol symbol;
  bool bVar1;
  bool bVar2;
  string *psVar3;
  EnumValueOptions *orig_options;
  Symbol symbol_00;
  string outer_scope;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_e0;
  undefined4 local_c0;
  undefined4 uStack_bc;
  EnumValueDescriptor *pEStack_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  psVar3 = DescriptorPool::Tables::AllocateString(this->tables_,(proto->name_).ptr_);
  *(string **)result = psVar3;
  *(int32 *)(result + 0x10) = proto->number_;
  *(EnumDescriptor **)(result + 0x18) = parent;
  psVar3 = DescriptorPool::Tables::AllocateString(this->tables_,*(string **)(parent + 8));
  std::__cxx11::string::resize((ulong)psVar3);
  std::__cxx11::string::append((string *)psVar3);
  *(string **)(result + 8) = psVar3;
  ValidateSymbolName(this,(proto->name_).ptr_,psVar3,&proto->super_Message);
  if (((proto->_has_bits_).has_bits_[0] & 2) == 0) {
    *(undefined8 *)(result + 0x20) = 0;
  }
  else {
    orig_options = proto->options_;
    if (orig_options == (EnumValueOptions *)0x0) {
      orig_options = (EnumValueOptions *)&_EnumValueOptions_default_instance_;
    }
    AllocateOptions<google::protobuf::EnumValueDescriptor>(this,orig_options,result);
  }
  local_c0 = 5;
  symbol._4_4_ = uStack_bc;
  symbol.type = 5;
  symbol.field_1.enum_value_descriptor = result;
  pEStack_b8 = result;
  bVar1 = AddSymbol(this,*(string **)(result + 8),*(void **)(parent + 0x18),*(string **)result,
                    &proto->super_Message,symbol);
  symbol_00.field_1.enum_value_descriptor = result;
  symbol_00._0_8_ = 5;
  bVar2 = FileDescriptorTables::AddAliasUnderParent
                    (this->file_tables_,parent,*(string **)result,symbol_00);
  if ((!bVar1) && (bVar2)) {
    outer_scope._M_dataplus._M_p = (pointer)&outer_scope.field_2;
    outer_scope._M_string_length = 0;
    outer_scope.field_2._M_local_buf[0] = '\0';
    std::__cxx11::string::_M_assign((string *)&outer_scope);
    if (outer_scope._M_string_length == 0) {
      std::__cxx11::string::assign((char *)&outer_scope);
    }
    else {
      std::operator+(&local_100,"\"",&outer_scope);
      std::operator+(&local_e0,&local_100,"\"");
      std::__cxx11::string::operator=((string *)&outer_scope,(string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_e0);
      std::__cxx11::string::~string((string *)&local_100);
    }
    psVar3 = *(string **)(result + 8);
    std::operator+(&local_b0,
                   "Note that enum values use C++ scoping rules, meaning that enum values are siblings of their type, not children of it.  Therefore, \""
                   ,*(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)result);
    std::operator+(&local_90,&local_b0,"\" must be unique within ");
    std::operator+(&local_70,&local_90,&outer_scope);
    std::operator+(&local_50,&local_70,", not just within \"");
    std::operator+(&local_100,&local_50,
                   *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)parent);
    std::operator+(&local_e0,&local_100,"\".");
    AddError(this,psVar3,&proto->super_Message,NAME,&local_e0);
    std::__cxx11::string::~string((string *)&local_e0);
    std::__cxx11::string::~string((string *)&local_100);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_90);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&outer_scope);
  }
  FileDescriptorTables::AddEnumValueByNumber(this->file_tables_,result);
  return;
}

Assistant:

void DescriptorBuilder::BuildEnumValue(const EnumValueDescriptorProto& proto,
                                       const EnumDescriptor* parent,
                                       EnumValueDescriptor* result) {
  result->name_   = tables_->AllocateString(proto.name());
  result->number_ = proto.number();
  result->type_   = parent;

  // Note:  full_name for enum values is a sibling to the parent's name, not a
  //   child of it.
  string* full_name = tables_->AllocateString(*parent->full_name_);
  full_name->resize(full_name->size() - parent->name_->size());
  full_name->append(*result->name_);
  result->full_name_ = full_name;

  ValidateSymbolName(proto.name(), *full_name, proto);

  // Copy options.
  if (!proto.has_options()) {
    result->options_ = NULL;  // Will set to default_instance later.
  } else {
    AllocateOptions(proto.options(), result);
  }

  // Again, enum values are weird because we makes them appear as siblings
  // of the enum type instead of children of it.  So, we use
  // parent->containing_type() as the value's parent.
  bool added_to_outer_scope =
    AddSymbol(result->full_name(), parent->containing_type(), result->name(),
              proto, Symbol(result));

  // However, we also want to be able to search for values within a single
  // enum type, so we add it as a child of the enum type itself, too.
  // Note:  This could fail, but if it does, the error has already been
  //   reported by the above AddSymbol() call, so we ignore the return code.
  bool added_to_inner_scope =
    file_tables_->AddAliasUnderParent(parent, result->name(), Symbol(result));

  if (added_to_inner_scope && !added_to_outer_scope) {
    // This value did not conflict with any values defined in the same enum,
    // but it did conflict with some other symbol defined in the enum type's
    // scope.  Let's print an additional error to explain this.
    string outer_scope;
    if (parent->containing_type() == NULL) {
      outer_scope = file_->package();
    } else {
      outer_scope = parent->containing_type()->full_name();
    }

    if (outer_scope.empty()) {
      outer_scope = "the global scope";
    } else {
      outer_scope = "\"" + outer_scope + "\"";
    }

    AddError(result->full_name(), proto,
             DescriptorPool::ErrorCollector::NAME,
             "Note that enum values use C++ scoping rules, meaning that "
             "enum values are siblings of their type, not children of it.  "
             "Therefore, \"" + result->name() + "\" must be unique within "
             + outer_scope + ", not just within \"" + parent->name() + "\".");
  }

  // An enum is allowed to define two numbers that refer to the same value.
  // FindValueByNumber() should return the first such value, so we simply
  // ignore AddEnumValueByNumber()'s return code.
  file_tables_->AddEnumValueByNumber(result);
}